

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O3

void debug_message(void *context,char *filename,longlong line,char *message)

{
  lua_State *plVar1;
  size_t sVar2;
  char temp [80];
  char acStack_78 [80];
  
  plVar1 = *context;
  sVar2 = strlen(filename);
  ravi_writestring(plVar1,filename,sVar2);
  snprintf(acStack_78,0x50,":%lld: ",line);
  plVar1 = *context;
  sVar2 = strlen(acStack_78);
  ravi_writestring(plVar1,acStack_78,sVar2);
  plVar1 = *context;
  sVar2 = strlen(message);
  ravi_writestring(plVar1,message,sVar2);
  ravi_writeline(*context);
  return;
}

Assistant:

static void debug_message(void* context, const char* filename, long long line, const char* message) {
  struct CompilerContext* ccontext = (struct CompilerContext*)context;
  ravi_writestring(ccontext->L, filename, strlen(filename));
  char temp[80];
  snprintf(temp, sizeof temp, ":%lld: ", line);
  ravi_writestring(ccontext->L, temp, strlen(temp));
  ravi_writestring(ccontext->L, message, strlen(message));
  ravi_writeline(ccontext->L);
}